

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O3

void sym_insert(BuildCtx *ctx,int32_t ofs,char *prefix,char *suffix)

{
  undefined8 *puVar1;
  BuildSym *pBVar2;
  bool bVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  
  lVar8 = (long)ctx->nsym;
  ctx->nsym = ctx->nsym + 1;
  if (0 < lVar8) {
    lVar5 = lVar8 << 4;
    do {
      pBVar2 = ctx->sym;
      if (*(int *)((long)pBVar2 + lVar5 + -8) <= ofs) goto LAB_0010a4b7;
      puVar1 = (undefined8 *)((long)&pBVar2[-1].name + lVar5);
      uVar4 = puVar1[1];
      puVar7 = (undefined8 *)((long)&pBVar2->name + lVar5);
      *puVar7 = *puVar1;
      puVar7[1] = uVar4;
      lVar5 = lVar5 + -0x10;
      bVar3 = 1 < lVar8;
      lVar8 = lVar8 + -1;
    } while (bVar3);
    lVar8 = 0;
  }
LAB_0010a4b7:
  ctx->sym[lVar8].ofs = ofs;
  pcVar6 = sym_decorate((BuildCtx *)(ulong)ctx->mode,prefix,suffix);
  ctx->sym[lVar8].name = pcVar6;
  return;
}

Assistant:

static void sym_insert(BuildCtx *ctx, int32_t ofs,
		       const char *prefix, const char *suffix)
{
  ptrdiff_t i = ctx->nsym++;
  while (i > 0) {
    if (ctx->sym[i-1].ofs <= ofs)
      break;
    ctx->sym[i] = ctx->sym[i-1];
    i--;
  }
  ctx->sym[i].ofs = ofs;
  ctx->sym[i].name = sym_decorate(ctx, prefix, suffix);
}